

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

download_priority_t __thiscall
libtorrent::aux::torrent::piece_priority(torrent *this,piece_index_t index)

{
  bool bVar1;
  element_type *this_00;
  pointer this_01;
  bool local_31;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_20;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1c;
  torrent *local_18;
  torrent *this_local;
  piece_index_t index_local;
  
  local_18 = this;
  this_local._0_4_ = index.m_val;
  bVar1 = has_picker(this);
  if (bVar1) {
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_1c,0);
    bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                      ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&this_local,
                       &local_1c);
    local_31 = true;
    if (!bVar1) {
      this_00 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->super_torrent_hot_members).m_torrent_file);
      local_20.m_val = (int)torrent_info::end_piece(this_00);
      local_31 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                           ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                            &this_local,&local_20);
    }
    if (local_31 == false) {
      this_01 = ::std::
                unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                ::operator->(&(this->super_torrent_hot_members).m_picker);
      this_local._7_1_ = piece_picker::piece_priority(this_01,this_local._0_4_);
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  else {
    this_local._7_1_ = '\x04';
  }
  return (download_priority_t)this_local._7_1_;
}

Assistant:

download_priority_t torrent::piece_priority(piece_index_t const index) const
	{
//		INVARIANT_CHECK;

		if (!has_picker()) return default_priority;

		// this call is only valid on torrents with metadata
		TORRENT_ASSERT(valid_metadata());
		if (index < piece_index_t(0) || index >= m_torrent_file->end_piece())
		{
			TORRENT_ASSERT_FAIL();
			return dont_download;
		}

		return m_picker->piece_priority(index);
	}